

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
btCompoundCollisionAlgorithm::processCollision
          (btCompoundCollisionAlgorithm *this,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap,btDispatcherInfo *dispatchInfo,
          btManifoldResult *resultOut)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  btCollisionShape *pbVar10;
  btCollisionAlgorithm *pbVar11;
  btPersistentManifold *this_00;
  btCollisionObject *pbVar12;
  btTransform *pbVar13;
  void *pvVar14;
  btDispatcher *pbVar15;
  btCollisionObjectWrapper *pbVar16;
  byte bVar17;
  byte bVar18;
  int iVar19;
  btCollisionObjectWrapper *pbVar20;
  btCollisionObject *pbVar21;
  long lVar22;
  btCollisionObject *pbVar23;
  long lVar24;
  int curSize;
  long lVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  btManifoldArray manifoldArray;
  btVector3 localAabbMax;
  btVector3 localAabbMin;
  btDbvtVolume bounds;
  btVector3 aabbMax1;
  btVector3 aabbMin1;
  btCompoundLeafCallback callback;
  undefined1 local_148 [28];
  undefined4 local_12c;
  undefined8 local_128;
  float local_120;
  undefined4 local_11c;
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  float fStack_100;
  btScalar bStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float local_e8;
  btScalar bStack_e4;
  btScalar bStack_e0;
  undefined8 local_d8;
  float afStack_d0 [2];
  float local_c8;
  float local_c4;
  float local_c0;
  undefined8 local_b8;
  float local_b0;
  undefined1 local_a8 [16];
  float local_90;
  float local_8c;
  float local_88;
  float local_80;
  float local_7c;
  float local_78;
  btCompoundLeafCallback local_70;
  
  local_a8._8_8_ = local_a8._0_8_;
  pbVar20 = body1Wrap;
  pbVar16 = body0Wrap;
  if (this->m_isSwapped != false) {
    pbVar20 = body0Wrap;
    pbVar16 = body1Wrap;
  }
  pbVar10 = pbVar16->m_shape;
  if (pbVar10[3].m_shapeType != this->m_compoundShapeRevision) {
    removeChildAlgorithms(this);
    preallocateChildAlgorithms(this,body0Wrap,body1Wrap);
    this->m_compoundShapeRevision = pbVar10[3].m_shapeType;
  }
  iVar19 = (this->m_childCollisionAlgorithms).m_size;
  if (iVar19 == 0) {
    return;
  }
  local_a8._0_8_ = pbVar10[3]._vptr_btCollisionShape;
  local_70.m_dispatcher =
       (this->super_btActivatingCollisionAlgorithm).super_btCollisionAlgorithm.m_dispatcher;
  local_70.m_childCollisionAlgorithms = (this->m_childCollisionAlgorithms).m_data;
  local_70.m_sharedManifold = this->m_sharedManifold;
  local_70.super_ICollide._vptr_ICollide = (_func_int **)&PTR__ICollide_0021c058;
  local_148[0x18] = 1;
  local_148._16_8_ = (btPersistentManifold **)0x0;
  local_148._8_4_ = 0.0;
  local_70.m_compoundColObjWrap = pbVar16;
  local_70.m_otherObjWrap = pbVar20;
  local_70.m_dispatchInfo = dispatchInfo;
  local_70.m_resultOut = resultOut;
  if (0 < iVar19) {
    lVar24 = 0;
    do {
      local_148._4_4_ = 0;
      pbVar11 = (this->m_childCollisionAlgorithms).m_data[lVar24];
      if (pbVar11 != (btCollisionAlgorithm *)0x0) {
        (*pbVar11->_vptr_btCollisionAlgorithm[4])(pbVar11,local_148);
        iVar19 = local_148._4_4_;
        if (0 < (int)local_148._4_4_) {
          lVar22 = 0;
          do {
            this_00 = *(btPersistentManifold **)(local_148._16_8_ + lVar22 * 8);
            if (this_00->m_cachedPoints != 0) {
              resultOut->m_manifoldPtr = this_00;
              pbVar23 = resultOut->m_body0Wrap->m_collisionObject;
              pbVar12 = resultOut->m_body1Wrap->m_collisionObject;
              pbVar21 = pbVar12;
              if (this_00->m_body0 != pbVar23) {
                pbVar21 = pbVar23;
                pbVar23 = pbVar12;
              }
              btPersistentManifold::refreshContactPoints
                        (this_00,&pbVar23->m_worldTransform,&pbVar21->m_worldTransform);
              resultOut->m_manifoldPtr = (btPersistentManifold *)0x0;
              iVar19 = local_148._4_4_;
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 < iVar19);
        }
        if (iVar19 < 0) {
          if ((int)local_148._8_4_ < 0) {
            if (((btPersistentManifold **)local_148._16_8_ != (btPersistentManifold **)0x0) &&
               ((bool)local_148[0x18] == true)) {
              btAlignedFreeInternal((void *)local_148._16_8_);
            }
            local_148[0x18] = 1;
            local_148._16_8_ = (btPersistentManifold **)0x0;
            local_148._8_4_ = 0.0;
          }
          lVar22 = (long)iVar19;
          do {
            *(btPersistentManifold **)(local_148._16_8_ + lVar22 * 8) = (btPersistentManifold *)0x0;
            lVar22 = lVar22 + 1;
          } while (lVar22 != 0);
        }
        iVar19 = (this->m_childCollisionAlgorithms).m_size;
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 < iVar19);
  }
  local_148._4_4_ = 0.0;
  btAlignedObjectArray<btPersistentManifold_*>::~btAlignedObjectArray
            ((btAlignedObjectArray<btPersistentManifold_*> *)local_148);
  uVar9 = local_a8._0_8_;
  if ((btDbvt *)local_a8._0_8_ == (btDbvt *)0x0) {
    lVar24 = (long)(this->m_childCollisionAlgorithms).m_size;
    if (lVar24 < 1) {
      afStack_d0[0]._0_1_ = 1;
      local_d8 = (btPersistentManifold **)0x0;
      bStack_e4 = 0.0;
      bStack_e0 = 0.0;
      goto LAB_0014c756;
    }
    lVar22 = 0x40;
    lVar25 = 0;
    do {
      btCompoundLeafCallback::ProcessChildShape
                (&local_70,*(btCollisionShape **)((long)pbVar10[1].m_userPointer + lVar22),
                 (int)lVar25);
      lVar25 = lVar25 + 1;
      lVar22 = lVar22 + 0x58;
    } while (lVar24 != lVar25);
  }
  else {
    btTransform::inverse(pbVar16->m_worldTransform);
    pbVar13 = pbVar20->m_worldTransform;
    fVar1 = (pbVar13->m_basis).m_el[0].m_floats[2];
    fVar2 = (pbVar13->m_basis).m_el[1].m_floats[2];
    fVar3 = (pbVar13->m_basis).m_el[2].m_floats[2];
    local_148._8_4_ = fVar3 * bStack_e0 + fVar1 * local_e8 + bStack_e4 * fVar2;
    local_148._24_4_ = fVar3 * afStack_d0[0] + fVar1 * (float)local_d8 + fVar2 * local_d8._4_4_;
    local_120 = fVar3 * local_c0 + fVar1 * local_c8 + fVar2 * local_c4;
    fVar1 = (pbVar13->m_origin).m_floats[0];
    fVar2 = (pbVar13->m_origin).m_floats[1];
    fVar3 = (pbVar13->m_origin).m_floats[2];
    uVar7 = *(undefined8 *)(pbVar13->m_basis).m_el[0].m_floats;
    uVar8 = *(undefined8 *)(pbVar13->m_basis).m_el[1].m_floats;
    fVar34 = (float)uVar8;
    fVar36 = (float)((ulong)uVar8 >> 0x20);
    fVar30 = (float)uVar7;
    fVar32 = (float)((ulong)uVar7 >> 0x20);
    uVar7 = *(undefined8 *)(pbVar13->m_basis).m_el[2].m_floats;
    fVar26 = (float)uVar7;
    fVar28 = (float)((ulong)uVar7 >> 0x20);
    local_148._0_4_ = bStack_e0 * fVar26 + local_e8 * fVar30 + bStack_e4 * fVar34;
    local_148._4_4_ = bStack_e0 * fVar28 + local_e8 * fVar32 + bStack_e4 * fVar36;
    local_148._12_4_ = 0;
    local_148._16_8_ =
         CONCAT44(afStack_d0[0] * fVar28 + (float)local_d8 * fVar32 + local_d8._4_4_ * fVar36,
                  afStack_d0[0] * fVar26 + (float)local_d8 * fVar30 + local_d8._4_4_ * fVar34);
    local_12c = 0;
    local_128 = CONCAT44(local_c0 * fVar28 + local_c8 * fVar32 + local_c4 * fVar36,
                         local_c0 * fVar26 + local_c8 * fVar30 + local_c4 * fVar34);
    local_11c = 0;
    local_118._4_4_ =
         (float)((ulong)local_b8 >> 0x20) +
         afStack_d0[0] * fVar3 + (float)local_d8 * fVar1 + fVar2 * local_d8._4_4_;
    local_118._0_4_ = (float)local_b8 + bStack_e0 * fVar3 + local_e8 * fVar1 + fVar2 * bStack_e4;
    local_118._8_4_ = fVar3 * local_c0 + fVar1 * local_c8 + local_c4 * fVar2 + local_b0;
    local_118._12_4_ = 0;
    (*pbVar20->m_shape->_vptr_btCollisionShape[2])(pbVar20->m_shape,local_148,&local_f8,&local_108);
    afStack_d0[1] = bStack_fc;
    afStack_d0[0] = fStack_100;
    btDbvt::collideTV((btDbvt *)uVar9,*(btDbvtNode **)uVar9,(btDbvtVolume *)&local_e8,
                      &local_70.super_ICollide);
  }
  lVar24 = (long)(this->m_childCollisionAlgorithms).m_size;
  afStack_d0[0]._0_1_ = 1;
  local_d8 = (btPersistentManifold **)0x0;
  bStack_e4 = 0.0;
  bStack_e0 = 0.0;
  if (0 < lVar24) {
    lVar22 = 0x40;
    lVar25 = 0;
    do {
      if ((this->m_childCollisionAlgorithms).m_data[lVar25] != (btCollisionAlgorithm *)0x0) {
        pvVar14 = pbVar10[1].m_userPointer;
        pbVar13 = pbVar16->m_worldTransform;
        fVar1 = (pbVar13->m_basis).m_el[0].m_floats[0];
        fVar2 = (pbVar13->m_basis).m_el[0].m_floats[1];
        fVar3 = (pbVar13->m_basis).m_el[0].m_floats[2];
        fVar26 = (pbVar13->m_basis).m_el[1].m_floats[0];
        fVar28 = (pbVar13->m_basis).m_el[1].m_floats[1];
        fVar30 = (pbVar13->m_basis).m_el[1].m_floats[2];
        fVar32 = (pbVar13->m_basis).m_el[2].m_floats[0];
        fVar34 = (pbVar13->m_basis).m_el[2].m_floats[1];
        local_a8 = ZEXT416((uint)fVar34);
        fVar36 = (pbVar13->m_basis).m_el[2].m_floats[2];
        fVar4 = *(float *)((long)pvVar14 + lVar22 + -0x38);
        fVar5 = *(float *)((long)pvVar14 + lVar22 + -0x28);
        fVar6 = *(float *)((long)pvVar14 + lVar22 + -0x18);
        local_148._8_4_ = fVar6 * fVar3 + fVar4 * fVar1 + fVar2 * fVar5;
        local_148._24_4_ = fVar6 * fVar30 + fVar4 * fVar26 + fVar28 * fVar5;
        local_120 = fVar6 * fVar36 + fVar4 * fVar32 + fVar5 * fVar34;
        fVar4 = *(float *)((long)pvVar14 + lVar22 + -0x10);
        fVar5 = *(float *)((long)pvVar14 + lVar22 + -0xc);
        fVar6 = *(float *)((long)pvVar14 + lVar22 + -8);
        uVar9 = *(undefined8 *)(pbVar13->m_origin).m_floats;
        uVar7 = *(undefined8 *)((long)pvVar14 + lVar22 + -0x40);
        uVar8 = *(undefined8 *)((long)pvVar14 + lVar22 + -0x30);
        fVar35 = (float)uVar8;
        fVar37 = (float)((ulong)uVar8 >> 0x20);
        fVar31 = (float)uVar7;
        fVar33 = (float)((ulong)uVar7 >> 0x20);
        uVar7 = *(undefined8 *)((long)pvVar14 + lVar22 + -0x20);
        fVar27 = (float)uVar7;
        fVar29 = (float)((ulong)uVar7 >> 0x20);
        local_148._0_4_ = fVar3 * fVar27 + fVar1 * fVar31 + fVar2 * fVar35;
        local_148._4_4_ = fVar3 * fVar29 + fVar1 * fVar33 + fVar2 * fVar37;
        local_148._12_4_ = 0;
        local_148._16_8_ =
             CONCAT44(fVar30 * fVar29 + fVar26 * fVar33 + fVar28 * fVar37,
                      fVar30 * fVar27 + fVar26 * fVar31 + fVar28 * fVar35);
        local_12c = 0;
        local_128 = CONCAT44(fVar36 * fVar29 + fVar32 * fVar33 + fVar34 * fVar37,
                             fVar36 * fVar27 + fVar32 * fVar31 + fVar34 * fVar35);
        local_11c = 0;
        local_118._4_4_ =
             fVar30 * fVar6 + fVar26 * fVar4 + fVar5 * fVar28 + (float)((ulong)uVar9 >> 0x20);
        local_118._0_4_ = fVar3 * fVar6 + fVar1 * fVar4 + fVar5 * fVar2 + (float)uVar9;
        local_118._8_4_ =
             fVar6 * fVar36 + fVar4 * fVar32 + fVar34 * fVar5 + (pbVar13->m_origin).m_floats[2];
        local_118._12_4_ = 0;
        (**(code **)(**(long **)((long)pvVar14 + lVar22) + 0x10))
                  (*(long **)((long)pvVar14 + lVar22),local_148,&local_f8,&local_108);
        (*pbVar20->m_shape->_vptr_btCollisionShape[2])
                  (pbVar20->m_shape,pbVar20->m_worldTransform,&local_80,&local_90);
        bVar17 = 1;
        if ((local_f8 <= local_90) && (bVar17 = 1, local_80 <= local_108)) {
          bVar17 = 0;
        }
        bVar18 = 1;
        if ((fStack_f0 <= local_88) && (local_78 <= fStack_100)) {
          bVar18 = bVar17;
        }
        if ((local_8c < fStack_f4) || (!(bool)(~bVar18 & local_7c <= fStack_104))) {
          (**(this->m_childCollisionAlgorithms).m_data[lVar25]->_vptr_btCollisionAlgorithm)();
          pbVar15 = (this->super_btActivatingCollisionAlgorithm).super_btCollisionAlgorithm.
                    m_dispatcher;
          (*pbVar15->_vptr_btDispatcher[0xf])
                    (pbVar15,(this->m_childCollisionAlgorithms).m_data[lVar25]);
          (this->m_childCollisionAlgorithms).m_data[lVar25] = (btCollisionAlgorithm *)0x0;
        }
      }
      lVar25 = lVar25 + 1;
      lVar22 = lVar22 + 0x58;
    } while (lVar24 != lVar25);
  }
LAB_0014c756:
  btAlignedObjectArray<btPersistentManifold_*>::~btAlignedObjectArray
            ((btAlignedObjectArray<btPersistentManifold_*> *)&local_e8);
  return;
}

Assistant:

void btCompoundCollisionAlgorithm::processCollision (const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	const btCollisionObjectWrapper* colObjWrap = m_isSwapped? body1Wrap : body0Wrap;
	const btCollisionObjectWrapper* otherObjWrap = m_isSwapped? body0Wrap : body1Wrap;

	btAssert (colObjWrap->getCollisionShape()->isCompound());
	const btCompoundShape* compoundShape = static_cast<const btCompoundShape*>(colObjWrap->getCollisionShape());

	///btCompoundShape might have changed:
	////make sure the internal child collision algorithm caches are still valid
	if (compoundShape->getUpdateRevision() != m_compoundShapeRevision)
	{
		///clear and update all
		removeChildAlgorithms();
		
		preallocateChildAlgorithms(body0Wrap,body1Wrap);
		m_compoundShapeRevision = compoundShape->getUpdateRevision();
	}

    if (m_childCollisionAlgorithms.size()==0)
        return;
    
	const btDbvt* tree = compoundShape->getDynamicAabbTree();
	//use a dynamic aabb tree to cull potential child-overlaps
	btCompoundLeafCallback  callback(colObjWrap,otherObjWrap,m_dispatcher,dispatchInfo,resultOut,&m_childCollisionAlgorithms[0],m_sharedManifold);

	///we need to refresh all contact manifolds
	///note that we should actually recursively traverse all children, btCompoundShape can nested more then 1 level deep
	///so we should add a 'refreshManifolds' in the btCollisionAlgorithm
	{
		int i;
		btManifoldArray manifoldArray;
		for (i=0;i<m_childCollisionAlgorithms.size();i++)
		{
			if (m_childCollisionAlgorithms[i])
			{
				m_childCollisionAlgorithms[i]->getAllContactManifolds(manifoldArray);
				for (int m=0;m<manifoldArray.size();m++)
				{
					if (manifoldArray[m]->getNumContacts())
					{
						resultOut->setPersistentManifold(manifoldArray[m]);
						resultOut->refreshContactPoints();
						resultOut->setPersistentManifold(0);//??necessary?
					}
				}
				manifoldArray.resize(0);
			}
		}
	}

	if (tree)
	{

		btVector3 localAabbMin,localAabbMax;
		btTransform otherInCompoundSpace;
		otherInCompoundSpace = colObjWrap->getWorldTransform().inverse() * otherObjWrap->getWorldTransform();
		otherObjWrap->getCollisionShape()->getAabb(otherInCompoundSpace,localAabbMin,localAabbMax);

		const ATTRIBUTE_ALIGNED16(btDbvtVolume)	bounds=btDbvtVolume::FromMM(localAabbMin,localAabbMax);
		//process all children, that overlap with  the given AABB bounds
		tree->collideTV(tree->m_root,bounds,callback);

	} else
	{
		//iterate over all children, perform an AABB check inside ProcessChildShape
		int numChildren = m_childCollisionAlgorithms.size();
		int i;
		for (i=0;i<numChildren;i++)
		{
			callback.ProcessChildShape(compoundShape->getChildShape(i),i);
		}
	}

	{
				//iterate over all children, perform an AABB check inside ProcessChildShape
		int numChildren = m_childCollisionAlgorithms.size();
		int i;
		btManifoldArray	manifoldArray;
        const btCollisionShape* childShape = 0;
        btTransform	orgTrans;
        
        btTransform	newChildWorldTrans;
        btVector3 aabbMin0,aabbMax0,aabbMin1,aabbMax1;        
        
		for (i=0;i<numChildren;i++)
		{
			if (m_childCollisionAlgorithms[i])
			{
				childShape = compoundShape->getChildShape(i);
			//if not longer overlapping, remove the algorithm
				orgTrans = colObjWrap->getWorldTransform();
                
				const btTransform& childTrans = compoundShape->getChildTransform(i);
                newChildWorldTrans = orgTrans*childTrans ;

				//perform an AABB check first
				childShape->getAabb(newChildWorldTrans,aabbMin0,aabbMax0);
				otherObjWrap->getCollisionShape()->getAabb(otherObjWrap->getWorldTransform(),aabbMin1,aabbMax1);

				if (!TestAabbAgainstAabb2(aabbMin0,aabbMax0,aabbMin1,aabbMax1))
				{
					m_childCollisionAlgorithms[i]->~btCollisionAlgorithm();
					m_dispatcher->freeCollisionAlgorithm(m_childCollisionAlgorithms[i]);
					m_childCollisionAlgorithms[i] = 0;
				}
			}
		}
	}
}